

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O0

void Rml::PluginRegistry::NotifyContextDestroy(Context *context)

{
  bool bVar1;
  PluginVectors *this;
  reference ppPVar2;
  Plugin *plugin;
  iterator __end1;
  iterator __begin1;
  Vector<Plugin_*> *__range1;
  Context *context_local;
  
  this = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                   ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  __end1 = ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::begin(&this->basic);
  plugin = (Plugin *)::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::end(&this->basic)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>
                                *)&plugin);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>
              ::operator*(&__end1);
    (*(*ppPVar2)->_vptr_Plugin[6])(*ppPVar2,context);
    __gnu_cxx::
    __normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void PluginRegistry::NotifyContextDestroy(Context* context)
{
	for (Plugin* plugin : plugin_vectors->basic)
		plugin->OnContextDestroy(context);
}